

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

BIO * BIO_push(BIO *b,BIO *append)

{
  BIO *pBVar1;
  BIO *pBVar2;
  
  pBVar1 = b;
  if (b != (BIO *)0x0) {
    do {
      pBVar2 = pBVar1;
      pBVar1 = (BIO *)pBVar2->ptr;
    } while (pBVar1 != (BIO *)0x0);
    pBVar2->ptr = append;
  }
  return b;
}

Assistant:

BIO *BIO_push(BIO *bio, BIO *appended_bio) {
  BIO *last_bio;

  if (bio == NULL) {
    return bio;
  }

  last_bio = bio;
  while (last_bio->next_bio != NULL) {
    last_bio = last_bio->next_bio;
  }

  last_bio->next_bio = appended_bio;
  return bio;
}